

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_consecrate(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  ulong uVar1;
  ROOM_INDEX_DATA *pRVar2;
  EXIT_DATA *pEVar3;
  ROOM_INDEX_DATA *pRVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  CHAR_DATA *in_RDX;
  int in_EDI;
  __type_conflict2 _Var9;
  int chance;
  AFFECT_DATA af;
  ROOM_AFFECT_DATA raf;
  EXIT_DATA *pexit;
  int door;
  int count;
  ROOM_INDEX_DATA *room_check;
  ROOM_INDEX_DATA *in_room;
  AFFECT_DATA *in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffee0;
  CHAR_DATA *in_stack_fffffffffffffee8;
  CHAR_DATA *ch_00;
  ROOM_INDEX_DATA *in_stack_fffffffffffffef0;
  int local_38;
  int local_34;
  
  bVar5 = is_affected(in_RDX,in_EDI);
  if (bVar5) {
    send_to_char((char *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  }
  else {
    if ((in_RDX->in_room->vnum != 0x4bc) &&
       (uVar1 = in_RDX->in_room->room_flags[0], _Var9 = std::pow<int,int>(0,0x61e487),
       (uVar1 & (long)_Var9) == 0)) {
      in_stack_fffffffffffffef0 = (ROOM_INDEX_DATA *)in_RDX->in_room->room_flags[0];
      _Var9 = std::pow<int,int>(0,0x61e4c4);
      if (((ulong)in_stack_fffffffffffffef0 & (long)_Var9) == 0) {
        bVar5 = is_affected_room(in_RDX->in_room,(int)gsn_consecrate);
        if (bVar5) {
          send_to_char((char *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
          return;
        }
        ch_00 = (CHAR_DATA *)in_RDX->in_room->room_flags[0];
        _Var9 = std::pow<int,int>(0,0x61e557);
        if (((ulong)ch_00 & (long)_Var9) == 0) {
          send_to_char((char *)in_stack_fffffffffffffef0,ch_00);
          return;
        }
        iVar6 = (int)in_RDX->level;
        iVar7 = iVar6 + (int)in_RDX->pcdata->learned[in_EDI] / 2;
        pRVar2 = in_RDX->in_room;
        local_34 = 0;
        for (local_38 = 0; local_38 < 6; local_38 = local_38 + 1) {
          pEVar3 = pRVar2->exit[local_38];
          if (((pEVar3 != (EXIT_DATA *)0x0) &&
              (pRVar4 = (pEVar3->u1).to_room, pRVar4 != (ROOM_INDEX_DATA *)0x0)) &&
             (pRVar4 != pRVar2)) {
            in_stack_fffffffffffffed8 = (AFFECT_DATA *)pRVar4->room_flags[0];
            _Var9 = std::pow<int,int>(0,0x61e678);
            if (((ulong)in_stack_fffffffffffffed8 & (long)_Var9) != 0) {
              local_34 = local_34 + 1;
            }
          }
        }
        act((char *)in_stack_fffffffffffffef0,ch_00,
            (void *)CONCAT44(iVar6,in_stack_fffffffffffffee0),in_stack_fffffffffffffed8,0);
        send_to_char((char *)in_stack_fffffffffffffef0,ch_00);
        iVar8 = number_percent();
        if (iVar7 + local_34 * -10 < iVar8) {
          act((char *)in_stack_fffffffffffffef0,ch_00,
              (void *)CONCAT44(iVar6,in_stack_fffffffffffffee0),in_stack_fffffffffffffed8,0);
          send_to_char((char *)in_stack_fffffffffffffef0,ch_00);
          return;
        }
        act((char *)in_stack_fffffffffffffef0,ch_00,
            (void *)CONCAT44(iVar6,in_stack_fffffffffffffee0),in_stack_fffffffffffffed8,0);
        send_to_char((char *)in_stack_fffffffffffffef0,ch_00);
        init_affect_room((ROOM_AFFECT_DATA *)0x61e778);
        number_range(in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
        new_affect_to_room(in_stack_fffffffffffffef0,(ROOM_AFFECT_DATA *)ch_00);
        init_affect((AFFECT_DATA *)0x61e824);
        affect_to_char((CHAR_DATA *)CONCAT44(iVar6,in_stack_fffffffffffffee0),
                       in_stack_fffffffffffffed8);
        return;
      }
    }
    send_to_char((char *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  }
  return;
}

Assistant:

void spell_consecrate(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	ROOM_INDEX_DATA *in_room;
	ROOM_INDEX_DATA *room_check;
	int count, door;
	EXIT_DATA *pexit;
	ROOM_AFFECT_DATA raf;
	AFFECT_DATA af;
	int chance;

	if (is_affected(ch, sn))
	{
		send_to_char("You do not feel up to purging a room of evil yet.\n\r", ch);
		return;
	}

	if (ch->in_room->vnum == 1212
		|| IS_SET(ch->in_room->room_flags, ROOM_NO_CONSECRATE)
		|| IS_SET(ch->in_room->room_flags, ROOM_FORCE_DUEL))
	{
		send_to_char("Spell failed.\n\r", ch);
		return;
	}

	if (is_affected_room(ch->in_room, gsn_consecrate))
	{
		send_to_char("This room is already consecrated.\n\r", ch);
		return;
	}

	if (!IS_SET(ch->in_room->room_flags, ROOM_NO_RECALL))
	{
		send_to_char("This room is not in need of holy blessing.\n\r", ch);
		return;
	}

	chance = ch->level + (ch->pcdata->learned[sn] / 2);

	in_room = ch->in_room;
	count = 0;

	for (door = 0; door < 6; door++)
	{
		if ((pexit = in_room->exit[door]) == nullptr || (room_check = pexit->u1.to_room) == nullptr)
			continue;

		if (room_check == in_room)
			continue;

		if (IS_SET(room_check->room_flags, ROOM_NO_RECALL))
			count++;
	}

	chance -= count * 10;

	act("$n gestures around the room and utters a blessing of holy rights.", ch, 0, 0, TO_ROOM);
	send_to_char("You chant a blessing and give the divine somatic motions of consecration.\n\r", ch);

	if (number_percent() > chance)
	{
		act("You feel the atmosphere lighten for a moment but it passes.", ch, 0, 0, TO_ROOM);
		send_to_char("Your holy rights are invoked but fail to affect the room's evil.\n\r", ch);
		return;
	}

	act("The atmosphere in the room lightens.", ch, 0, 0, TO_ROOM);
	send_to_char("You succeed in consecrating the ground for a brief period!\n\r", ch);

	init_affect_room(&raf);
	raf.where = TO_ROOM_AFFECTS;
	raf.aftype = AFT_COMMUNE;
	raf.type = sn;
	raf.level = level;
	raf.duration = number_range(4, 6);
	raf.location = APPLY_NONE;
	raf.modifier = 0;
	raf.owner = ch;
	raf.end_fun = nullptr;
	raf.tick_fun = nullptr;
	new_affect_to_room(ch->in_room, &raf);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_COMMUNE;
	af.type = sn;
	af.location = 0;
	af.modifier = 0;
	af.level = level;
	af.duration = 15;
	affect_to_char(ch, &af);
}